

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Monotonicity.cpp
# Opt level: O0

void __thiscall FMB::Monotonicity::monotone(Monotonicity *this,Clause *c,Literal *l)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Literal *parent;
  TermList *t_00;
  Clause *in_RDX;
  Clause *in_RSI;
  Monotonicity *in_RDI;
  anon_union_4_2_6ac8864f_for_SATLiteral_0 unaff_retaddr;
  TermList *t;
  uint i;
  SATLiteral add;
  uint p;
  TermList *t2;
  TermList *t1;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar4;
  uint local_34;
  TermList *in_stack_ffffffffffffffe0;
  
  bVar1 = Kernel::Literal::isEquality((Literal *)0x2e0e57);
  if (bVar1) {
    parent = (Literal *)Kernel::Term::nthArgument((Term *)in_RDX,0);
    t_00 = Kernel::Term::nthArgument((Term *)in_RDX,1);
    iVar2 = Kernel::Literal::polarity((Literal *)0x2e0e8c);
    if (iVar2 != 0) {
      safe((Monotonicity *)in_RSI,in_RDX,parent,t_00);
      safe((Monotonicity *)in_RSI,in_RDX,parent,t_00);
    }
  }
  else {
    Kernel::Term::functor((Term *)in_RDX);
    iVar2 = Kernel::Literal::polarity((Literal *)0x2e0ee4);
    if (iVar2 == 0) {
      Lib::DHMap<unsigned_int,_SAT::SATLiteral,_Lib::DefaultHash,_Lib::DefaultHash2>::get
                ((DHMap<unsigned_int,_SAT::SATLiteral,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    }
    else {
      Lib::DHMap<unsigned_int,_SAT::SATLiteral,_Lib::DefaultHash,_Lib::DefaultHash2>::get
                ((DHMap<unsigned_int,_SAT::SATLiteral,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    }
    SAT::SATLiteral::opposite
              ((SATLiteral *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    local_34 = 0;
    while (uVar4 = local_34, uVar3 = Kernel::Term::arity((Term *)in_RDX), uVar4 < uVar3) {
      Kernel::Term::nthArgument((Term *)in_RDX,local_34);
      safe(in_RDI,in_RSI,(Literal *)in_RDX,in_stack_ffffffffffffffe0,
           (SATLiteral)unaff_retaddr.field_1);
      local_34 = local_34 + 1;
    }
  }
  return;
}

Assistant:

void Monotonicity::monotone(Clause* c, Literal* l)
{
  // if we have equality
  if(l->isEquality()){
    TermList* t1 = l->nthArgument(0);
    TermList* t2 = l->nthArgument(1);
    // t1 = t2
    if(l->polarity()){
      // add a clause for each
      safe(c,l,t1);
      safe(c,l,t2);
    }
    // t1 != t2
    else{
      // the true clause, skip
    }
  }
  else{
  // not equality
    unsigned p = l->functor();
    SATLiteral add = (l->polarity() ? _pF.get(p) : _pT.get(p)).opposite();
    for(unsigned i=0;i<l->arity();i++){
      TermList* t = l->nthArgument(i);
      safe(c,l,t,add);
    }
  }
}